

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall duckdb_re2::Prog::Prog(Prog *this)

{
  this->prefix_size_ = 0;
  this->list_count_ = 0;
  this->dfa_first_once_ = 0;
  this->dfa_longest_once_ = 0;
  this->anchor_start_ = false;
  this->anchor_end_ = false;
  this->reversed_ = false;
  this->did_flatten_ = false;
  this->did_onepass_ = false;
  this->start_ = 0;
  this->start_unanchored_ = 0;
  this->size_ = 0;
  this->bytemap_range_ = 0;
  this->prefix_foldcase_ = false;
  *(undefined8 *)
   &(this->list_heads_).ptr_._M_t.
    super___uniq_ptr_impl<unsigned_short,_duckdb_re2::PODArray<unsigned_short>::Deleter>._M_t.
    super__Tuple_impl<0UL,_unsigned_short_*,_duckdb_re2::PODArray<unsigned_short>::Deleter> = 0;
  (this->list_heads_).ptr_._M_t.
  super___uniq_ptr_impl<unsigned_short,_duckdb_re2::PODArray<unsigned_short>::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_short_*,_duckdb_re2::PODArray<unsigned_short>::Deleter>.
  super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl = (unsigned_short *)0x0;
  this->bit_state_text_max_size_ = 0;
  *(undefined8 *)
   &(this->inst_).ptr_._M_t.
    super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
       = 0;
  (this->inst_).ptr_._M_t.
  super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
  .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl = (Inst *)0x0;
  *(undefined8 *)
   &(this->onepass_nodes_).ptr_._M_t.
    super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter> = 0;
  (this->onepass_nodes_).ptr_._M_t.
  super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  this->dfa_mem_ = 0;
  this->dfa_first_ = (DFA *)0x0;
  this->dfa_longest_ = (DFA *)0x0;
  return;
}

Assistant:

Prog::Prog()
  : anchor_start_(false),
    anchor_end_(false),
    reversed_(false),
    did_flatten_(false),
    did_onepass_(false),
    start_(0),
    start_unanchored_(0),
    size_(0),
    bytemap_range_(0),
    prefix_foldcase_(false),
    prefix_size_(0),
    list_count_(0),
    bit_state_text_max_size_(0),
    dfa_mem_(0),
    dfa_first_(NULL),
    dfa_longest_(NULL) {
}